

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtUnionFind.cpp
# Opt level: O1

void __thiscall cbtUnionFind::sortIslands(cbtUnionFind *this)

{
  cbtElement *pcVar1;
  int iVar2;
  uint uVar3;
  cbtElement *pcVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  cbtElement *pcVar8;
  cbtUnionFindElementSortPredicate local_1;
  
  iVar2 = (this->m_elements).m_size;
  if (0 < (long)iVar2) {
    pcVar4 = (this->m_elements).m_data;
    uVar5 = 0;
    do {
      pcVar1 = pcVar4 + uVar5;
      uVar6 = (ulong)(uint)pcVar1->m_id;
      uVar7 = (uint)uVar5;
      pcVar8 = pcVar1;
      if (uVar5 != uVar6) {
        do {
          pcVar8->m_id = pcVar4[(int)uVar6].m_id;
          uVar7 = pcVar4[(int)uVar6].m_id;
          uVar3 = pcVar4[(int)uVar7].m_id;
          uVar6 = (ulong)uVar3;
          pcVar8 = pcVar4 + (int)uVar7;
        } while (uVar7 != uVar3);
      }
      pcVar1->m_id = uVar7;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (long)iVar2);
  }
  if (1 < iVar2) {
    cbtAlignedObjectArray<cbtElement>::quickSortInternal<cbtUnionFindElementSortPredicate>
              (&this->m_elements,&local_1,0,iVar2 + -1);
  }
  return;
}

Assistant:

void cbtUnionFind::sortIslands()
{
	//first store the original body index, and islandId
	int numElements = m_elements.size();

	for (int i = 0; i < numElements; i++)
	{
		m_elements[i].m_id = find(i);
#ifndef STATIC_SIMULATION_ISLAND_OPTIMIZATION
		m_elements[i].m_sz = i;
#endif  //STATIC_SIMULATION_ISLAND_OPTIMIZATION
	}

	// Sort the vector using predicate and std::sort
	//std::sort(m_elements.begin(), m_elements.end(), cbtUnionFindElementSortPredicate);
	m_elements.quickSort(cbtUnionFindElementSortPredicate());
}